

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::H2V1ConvertFiltered(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8 *puVar4;
  uint8 uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint local_88;
  uint local_84;
  int bc;
  int gc;
  int rc;
  int cr;
  int cb;
  int w1;
  int w0;
  int cr1;
  int cb1;
  int b;
  int cr0;
  int cb0;
  int a;
  int c_x1;
  int c_x0;
  int y;
  int x;
  int row_x8;
  int half_image_x_size;
  uint8 *d0;
  int row;
  uint BLOCKS_PER_MCU;
  jpeg_decoder *this_local;
  
  _row_x8 = this->m_pScan_line_0;
  uVar6 = (this->m_image_x_size >> 1) - 1;
  iVar7 = (this->m_max_mcu_y_size - this->m_mcu_lines_left) * 8;
  for (c_x0 = 0; c_x0 < this->m_image_x_size; c_x0 = c_x0 + 1) {
    puVar4 = this->m_pSample_buf;
    iVar8 = 0;
    if ((c_x0 & 8U) != 0) {
      iVar8 = 0x40;
    }
    iVar8 = check_sample_buf_ofs(this,(c_x0 >> 4) * 0x100 + iVar8 + (c_x0 & 7U) + iVar7);
    uVar9 = (uint)puVar4[iVar8];
    local_88 = c_x0 + -1 >> 1;
    local_84 = uVar6;
    if ((int)(local_88 + 1) < (int)uVar6) {
      local_84 = local_88 + 1;
    }
    if ((int)local_88 < 1) {
      local_88 = 0;
    }
    iVar8 = ((int)local_88 >> 3) * 0x100 + (local_88 & 7) + iVar7;
    puVar4 = this->m_pSample_buf;
    iVar10 = check_sample_buf_ofs(this,iVar8 + 0x80);
    bVar1 = puVar4[iVar10];
    puVar4 = this->m_pSample_buf;
    iVar8 = check_sample_buf_ofs(this,iVar8 + 0xc0);
    bVar2 = puVar4[iVar8];
    iVar8 = ((int)local_84 >> 3) * 0x100 + (local_84 & 7) + iVar7;
    puVar4 = this->m_pSample_buf;
    iVar10 = check_sample_buf_ofs(this,iVar8 + 0x80);
    bVar3 = puVar4[iVar10];
    puVar4 = this->m_pSample_buf;
    iVar8 = check_sample_buf_ofs(this,iVar8 + 0xc0);
    iVar10 = 1;
    if ((c_x0 & 1U) != 0) {
      iVar10 = 3;
    }
    iVar11 = 3;
    if ((c_x0 & 1U) != 0) {
      iVar11 = 1;
    }
    iVar12 = (int)((uint)bVar1 * iVar10 + (uint)bVar3 * iVar11 + 2) >> 2;
    iVar13 = (int)((uint)bVar2 * iVar10 + (uint)puVar4[iVar8] * iVar11 + 2) >> 2;
    iVar8 = this->m_crg[iVar13];
    iVar10 = this->m_cbg[iVar12];
    iVar11 = this->m_cbb[iVar12];
    uVar5 = clamp(uVar9 + this->m_crr[iVar13]);
    *_row_x8 = uVar5;
    uVar5 = clamp(uVar9 + (iVar8 + iVar10 >> 0x10));
    _row_x8[1] = uVar5;
    uVar5 = clamp(uVar9 + iVar11);
    _row_x8[2] = uVar5;
    _row_x8[3] = 0xff;
    _row_x8 = _row_x8 + 4;
  }
  return;
}

Assistant:

void jpeg_decoder::H2V1ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 4;
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;

		const int half_image_x_size = (m_image_x_size >> 1) - 1;
		const int row_x8 = row * 8;

		for (int x = 0; x < m_image_x_size; x++)
		{
			int y = m_pSample_buf[check_sample_buf_ofs((x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7) + row_x8)];

			int c_x0 = (x - 1) >> 1;
			int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
			c_x0 = JPGD_MAX(c_x0, 0);

			int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7) + row_x8 + 128;
			int cb0 = m_pSample_buf[check_sample_buf_ofs(a)];
			int cr0 = m_pSample_buf[check_sample_buf_ofs(a + 64)];

			int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7) + row_x8 + 128;
			int cb1 = m_pSample_buf[check_sample_buf_ofs(b)];
			int cr1 = m_pSample_buf[check_sample_buf_ofs(b + 64)];

			int w0 = (x & 1) ? 3 : 1;
			int w1 = (x & 1) ? 1 : 3;

			int cb = (cb0 * w0 + cb1 * w1 + 2) >> 2;
			int cr = (cr0 * w0 + cr1 * w1 + 2) >> 2;

			int rc = m_crr[cr];
			int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
			int bc = m_cbb[cb];

			d0[0] = clamp(y + rc);
			d0[1] = clamp(y + gc);
			d0[2] = clamp(y + bc);
			d0[3] = 255;

			d0 += 4;
		}
	}